

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O0

void golf_audio_init(void)

{
  saudio_desc local_38;
  
  local_38.sample_rate = 0xac44;
  local_38.num_channels = 0;
  local_38.buffer_frames = 0x400;
  local_38.packet_frames = 0x40;
  local_38.num_packets = 0x20;
  local_38.stream_cb = (_func_void_float_ptr_int_int *)0x0;
  local_38.stream_userdata_cb = (_func_void_float_ptr_int_int_void_ptr *)0x0;
  local_38.user_data = (void *)0x0;
  saudio_setup(&local_38);
  golf_data_load("data/audio/confirmation_002.ogg",false);
  golf_data_load("data/audio/drop_001.ogg",false);
  golf_data_load("data/audio/drop_003.ogg",false);
  golf_data_load("data/audio/error_008.ogg",false);
  golf_data_load("data/audio/footstep_grass_004.ogg",false);
  golf_data_load("data/audio/impactPlank_medium_000.ogg",false);
  golf_data_load("data/audio/in_water.ogg",false);
  memset(&_sounds,0,0x40);
  _sounds.alloc_category = "audio";
  return;
}

Assistant:

void golf_audio_init(void) {
    saudio_setup(&(saudio_desc){
            .sample_rate = 44100,
            .buffer_frames = 1024,
            .packet_frames = 64,
            .num_packets = 32, 
            });

    golf_data_load("data/audio/confirmation_002.ogg", false);
    golf_data_load("data/audio/drop_001.ogg", false);
    golf_data_load("data/audio/drop_003.ogg", false);
    golf_data_load("data/audio/error_008.ogg", false);
    golf_data_load("data/audio/footstep_grass_004.ogg", false);
    golf_data_load("data/audio/impactPlank_medium_000.ogg", false);
    golf_data_load("data/audio/in_water.ogg", false);
    map_init(&_sounds, "audio");
}